

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator_tests.cpp
# Opt level: O3

void apply_constant<ear::dsp::LinearInterpSingle,Eigen::Matrix<float,_1,1,0,_1,1>&,Eigen::Matrix<float,_1,1,0,_1,1>&,float>
               (Matrix<float,__1,_1,_0,__1,_1> *in,Matrix<float,__1,_1,_0,__1,_1> *out,float *point)

{
  long lVar1;
  long lVar2;
  long lVar3;
  value_type *__val;
  long lVar4;
  long *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  
  local_48 = (long *)operator_new(8);
  local_40 = local_48 + 1;
  *local_48 = 0;
  local_38 = local_40;
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::Matrix<float,_1,1,0,_1,1>&>
            ((PtrAdapterT<float*> *)&local_48,in,0);
  local_30 = (long *)operator_new(8);
  local_28 = local_30 + 1;
  *local_30 = 0;
  local_20 = local_28;
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::Matrix<float,_1,1,0,_1,1>&>
            ((PtrAdapterT<float*> *)&local_30,out,0);
  lVar1 = (in->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar1) {
    lVar2 = *local_48;
    lVar3 = *local_30;
    lVar4 = 0;
    do {
      *(float *)(lVar3 + lVar4 * 4) = *(float *)(lVar2 + lVar4 * 4) * *point;
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  if (local_30 != (long *)0x0) {
    operator_delete(local_30,(long)local_20 - (long)local_30);
  }
  if (local_48 != (long *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void apply_constant(In &&in, Out &&out, const Point &point) {
  PtrAdapter in_p(in.cols());
  in_p.set_eigen(in);
  PtrAdapter out_p(out.cols());
  out_p.set_eigen(out);

  Interp::apply_constant(in_p.ptrs(), out_p.ptrs(), 0, (SampleIndex)in.rows(),
                         point);
}